

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

Fl_Help_Block * __thiscall
Fl_Help_View::add_block(Fl_Help_View *this,char *s,int xx,int yy,int ww,int hh,uchar border)

{
  Fl_Help_Block *pFVar1;
  Fl_Help_Block *temp;
  int hh_local;
  int ww_local;
  int yy_local;
  int xx_local;
  char *s_local;
  Fl_Help_View *this_local;
  
  if (this->ablocks_ <= this->nblocks_) {
    this->ablocks_ = this->ablocks_ + 0x10;
    if (this->ablocks_ == 0x10) {
      pFVar1 = (Fl_Help_Block *)malloc((long)this->ablocks_ * 0xa8);
      this->blocks_ = pFVar1;
    }
    else {
      pFVar1 = (Fl_Help_Block *)realloc(this->blocks_,(long)this->ablocks_ * 0xa8);
      this->blocks_ = pFVar1;
    }
  }
  pFVar1 = this->blocks_ + this->nblocks_;
  memset(pFVar1,0,0xa8);
  pFVar1->start = s;
  pFVar1->end = s;
  pFVar1->x = xx;
  pFVar1->y = yy;
  pFVar1->w = ww;
  pFVar1->h = hh;
  pFVar1->border = border;
  pFVar1->bgcolor = this->bgcolor_;
  this->nblocks_ = this->nblocks_ + 1;
  return pFVar1;
}

Assistant:

Fl_Help_Block *					// O - Pointer to new block
Fl_Help_View::add_block(const char   *s,	// I - Pointer to start of block text
                	int           xx,	// I - X position of block
			int           yy,	// I - Y position of block
			int           ww,	// I - Right margin of block
			int           hh,	// I - Height of block
			unsigned char border)	// I - Draw border?
{
  Fl_Help_Block	*temp;				// New block


  // printf("add_block(s = %p, xx = %d, yy = %d, ww = %d, hh = %d, border = %d)\n",
  //        s, xx, yy, ww, hh, border);

  if (nblocks_ >= ablocks_)
  {
    ablocks_ += 16;

    if (ablocks_ == 16)
      blocks_ = (Fl_Help_Block *)malloc(sizeof(Fl_Help_Block) * ablocks_);
    else
      blocks_ = (Fl_Help_Block *)realloc(blocks_, sizeof(Fl_Help_Block) * ablocks_);
  }

  temp = blocks_ + nblocks_;
  memset(temp, 0, sizeof(Fl_Help_Block));
  temp->start   = s;
  temp->end     = s;
  temp->x       = xx;
  temp->y       = yy;
  temp->w       = ww;
  temp->h       = hh;
  temp->border  = border;
  temp->bgcolor = bgcolor_;
  nblocks_ ++;

  return (temp);
}